

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::tuple<TestFunction,_int>_&> *
testing::A<std::tuple<TestFunction,int>const&>(void)

{
  void *__s;
  Matcher<const_std::tuple<TestFunction,_int>_&> *in_RDI;
  MatcherInterface<const_std::tuple<TestFunction,_int>_&> *in_stack_ffffffffffffffd8;
  Matcher<const_std::tuple<TestFunction,_int>_&> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<const_std::tuple<TestFunction,_int>_&>::AnyMatcherImpl
            ((AnyMatcherImpl<const_std::tuple<TestFunction,_int>_&> *)this);
  MakeMatcher<std::tuple<TestFunction,int>const&>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }